

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

NeuralNetwork * __thiscall CoreML::Specification::Model::mutable_neuralnetwork(Model *this)

{
  bool bVar1;
  NeuralNetwork *this_00;
  Model *this_local;
  
  bVar1 = has_neuralnetwork(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_neuralnetwork(this);
    this_00 = (NeuralNetwork *)operator_new(0x58);
    NeuralNetwork::NeuralNetwork(this_00);
    (this->Type_).neuralnetwork_ = this_00;
  }
  return (NeuralNetwork *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::NeuralNetwork* Model::mutable_neuralnetwork() {
  if (!has_neuralnetwork()) {
    clear_Type();
    set_has_neuralnetwork();
    Type_.neuralnetwork_ = new ::CoreML::Specification::NeuralNetwork;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.neuralNetwork)
  return Type_.neuralnetwork_;
}